

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_TrueTypeEngineType FT_Get_TrueType_Engine_Type(FT_Library library)

{
  FT_Module_Requester p_Var1;
  FT_Module pFVar2;
  FT_TrueTypeEngineType *pFVar3;
  FT_TrueTypeEngineType FVar4;
  FT_TrueTypeEngineType FVar5;
  
  FVar4 = FT_TRUETYPE_ENGINE_TYPE_NONE;
  FVar5 = FT_TRUETYPE_ENGINE_TYPE_NONE;
  if (library != (FT_Library)0x0) {
    pFVar2 = FT_Get_Module(library,"truetype");
    FVar5 = FVar4;
    if ((pFVar2 != (FT_Module)0x0) &&
       (p_Var1 = pFVar2->clazz->get_interface, p_Var1 != (FT_Module_Requester)0x0)) {
      pFVar3 = (FT_TrueTypeEngineType *)(*p_Var1)(pFVar2,"truetype-engine");
      if (pFVar3 != (FT_TrueTypeEngineType *)0x0) {
        FVar5 = *pFVar3;
      }
    }
  }
  return FVar5;
}

Assistant:

FT_EXPORT_DEF( FT_TrueTypeEngineType )
  FT_Get_TrueType_Engine_Type( FT_Library  library )
  {
    FT_TrueTypeEngineType  result = FT_TRUETYPE_ENGINE_TYPE_NONE;


    if ( library )
    {
      FT_Module  module = FT_Get_Module( library, "truetype" );


      if ( module )
      {
        FT_Service_TrueTypeEngine  service;


        service = (FT_Service_TrueTypeEngine)
                    ft_module_get_service( module,
                                           FT_SERVICE_ID_TRUETYPE_ENGINE,
                                           0 );
        if ( service )
          result = service->engine_type;
      }
    }

    return result;
  }